

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O0

void main_sheet_get_relid_expat_callback_element_start
               (void *callbackdata,XML_Char *name,XML_Char **atts)

{
  int iVar1;
  XML_Char *pXVar2;
  char *pcVar3;
  XML_Char *relid;
  XML_Char *sheetname;
  main_sheet_get_rels_callback_data *data;
  XML_Char **atts_local;
  XML_Char *name_local;
  void *callbackdata_local;
  
  iVar1 = XML_Char_icmp_ins(name,"sheet");
  if ((((iVar1 == 0) && (pXVar2 = get_expat_attr_by_name(atts,"name"), pXVar2 != (XML_Char *)0x0))
      && ((*(long *)((long)callbackdata + 8) == 0 ||
          (iVar1 = strcasecmp(pXVar2,*(char **)((long)callbackdata + 8)), iVar1 == 0)))) &&
     ((pXVar2 = get_expat_attr_by_name(atts,"r:id"), pXVar2 != (XML_Char *)0x0 && (*pXVar2 != '\0'))
     )) {
    pcVar3 = strdup(pXVar2);
    *(char **)((long)callbackdata + 0x18) = pcVar3;
    XML_StopParser(*callbackdata,0);
  }
  return;
}

Assistant:

void main_sheet_get_relid_expat_callback_element_start (void* callbackdata, const XML_Char* name, const XML_Char** atts)
{
  struct main_sheet_get_rels_callback_data* data = (struct main_sheet_get_rels_callback_data*)callbackdata;
  if (XML_Char_icmp_ins(name, X("sheet")) == 0) {
    const XML_Char* sheetname;
    if ((sheetname = get_expat_attr_by_name(atts, X("name"))) != NULL && (!data->sheetname || XML_Char_icmp(sheetname, data->sheetname) == 0)) {
      const XML_Char* relid = get_expat_attr_by_name(atts, X("r:id"));
      if (relid && *relid) {
        data->sheetrelid = XML_Char_dup(relid);
        XML_StopParser(data->xmlparser, XML_FALSE);
        return;
      }
    }
  }
}